

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O2

bool __thiscall
sf::VertexBuffer::update(VertexBuffer *this,Vertex *vertices,size_t vertexCount,uint offset)

{
  bool bVar1;
  GLenum GVar2;
  TransientContextLock contextLock;
  TransientContextLock local_31;
  
  bVar1 = false;
  if ((vertices != (Vertex *)0x0) && (bVar1 = false, this->m_buffer != 0)) {
    if ((offset == 0) || (vertexCount + offset <= this->m_size)) {
      GlResource::TransientContextLock::TransientContextLock(&local_31);
      (*sf_glad_glBindBufferARB)(0x8892,this->m_buffer);
      if (this->m_size <= vertexCount) {
        GVar2 = 0x88e4;
        if (this->m_usage != Static) {
          GVar2 = (uint)(this->m_usage == Dynamic) * 8 + 0x88e0;
        }
        (*sf_glad_glBufferDataARB)(0x8892,vertexCount * 0x14,(void *)0x0,GVar2);
        this->m_size = vertexCount;
      }
      (*sf_glad_glBufferSubDataARB)(0x8892,(ulong)offset * 0x14,vertexCount * 0x14,vertices);
      (*sf_glad_glBindBufferARB)(0x8892,0);
      GlResource::TransientContextLock::~TransientContextLock(&local_31);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool VertexBuffer::update(const Vertex* vertices, std::size_t vertexCount, unsigned int offset)
{
    // Sanity checks
    if (!m_buffer)
        return false;

    if (!vertices)
        return false;

    if (offset && (offset + vertexCount > m_size))
        return false;

    TransientContextLock contextLock;

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    // Check if we need to resize or orphan the buffer
    if (vertexCount >= m_size)
    {
        glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexCount), 0, VertexBufferImpl::usageToGlEnum(m_usage)));

        m_size = vertexCount;
    }

    glCheck(GLEXT_glBufferSubData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLintptrARB>(sizeof(Vertex) * offset), static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexCount), vertices));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    return true;
}